

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLoader.c
# Opt level: O2

UINT32 MemoryLoader_ReadDataGZ(MEMORY_LOADER *loader,UINT8 *buffer,UINT32 numBytes)

{
  UINT32 UVar1;
  UINT32 UVar2;
  int iVar3;
  
  (loader->zStream).avail_out = numBytes;
  (loader->zStream).next_out = buffer;
  iVar3 = inflate(&loader->zStream,2);
  UVar1 = loader->pos;
  UVar2 = (UINT32)(loader->zStream).total_out;
  loader->pos = UVar2;
  if (iVar3 == 1) {
    loader->decSize = UVar2;
  }
  return UVar2 - UVar1;
}

Assistant:

static UINT32 MemoryLoader_ReadDataGZ(MEMORY_LOADER *loader, UINT8 *buffer, UINT32 numBytes)
{
	int ret;
	UINT32 bytesWritten;

	loader->zStream.avail_out = numBytes;
	loader->zStream.next_out = (Bytef *)buffer;
	ret = inflate(&loader->zStream, Z_SYNC_FLUSH);
	// usually returns Z_OK or Z_STREAM_END (when encountering EOF)
	// but even in case of errors, we'll just return the amount of bytes read.
	// TODO: maybe return 0 when getting errors in order to prevent playing garbage data.

	bytesWritten = loader->zStream.total_out - loader->pos;
	loader->pos = loader->zStream.total_out;
	if (ret == Z_STREAM_END)
		loader->decSize = loader->pos;
	return bytesWritten;
}